

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
inipp::Format<char>::local_symbol
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Format<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  char __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_local;
  Format<char> *this_local;
  
  __lhs = this->char_interpol;
  local_20 = name;
  name_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (Format<char> *)__return_storage_ptr__;
  std::operator+(&local_60,this->char_interpol_start,name);
  std::operator+(&local_40,&local_60,this->char_interpol_end);
  std::operator+(__return_storage_ptr__,__lhs,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<CharT> local_symbol(const std::basic_string<CharT>& name) const {
		return char_interpol + (char_interpol_start + name + char_interpol_end);
	}